

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_color nk_rgb_hex(char *rgb)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int in_ESI;
  ulong uVar4;
  
  uVar4 = (ulong)(*rgb == '#');
  uVar1 = nk_parse_hex(rgb + uVar4,in_ESI);
  uVar2 = nk_parse_hex(rgb + uVar4 + 2,in_ESI);
  iVar3 = nk_parse_hex(rgb + uVar4 + 4,in_ESI);
  return (nk_color)(iVar3 << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff | 0xff000000);
}

Assistant:

NK_API struct nk_color
nk_rgb_hex(const char *rgb)
{
struct nk_color col;
const char *c = rgb;
if (*c == '#') c++;
col.r = (nk_byte)nk_parse_hex(c, 2);
col.g = (nk_byte)nk_parse_hex(c+2, 2);
col.b = (nk_byte)nk_parse_hex(c+4, 2);
col.a = 255;
return col;
}